

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O0

string * __thiscall
OpenMD::SelectionCompiler::getUnescapedStringLiteral_abi_cxx11_(SelectionCompiler *this)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  SelectionCompiler *in_RSI;
  string *in_RDI;
  int hexit;
  char chT;
  int k;
  int unicode;
  int digitCount;
  char ch;
  int ich;
  int ichMax;
  string *sb;
  allocator<char> *in_stack_ffffffffffffff68;
  char in_stack_ffffffffffffff77;
  size_type in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  int local_3c;
  int local_2c;
  allocator<char> local_12;
  undefined1 local_11;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff77,
             in_stack_ffffffffffffff68);
  std::allocator<char>::~allocator(&local_12);
  iVar3 = in_RSI->ichToken + in_RSI->cchToken + -1;
  local_2c = in_RSI->ichToken + 1;
  do {
    if (iVar3 <= local_2c) {
      return in_RDI;
    }
    iVar1 = local_2c + 1;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&in_RSI->script);
    if ((*pcVar2 == '\\') && (iVar1 < iVar3)) {
      local_2c = local_2c + 2;
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&in_RSI->script);
      switch(*pcVar2) {
      case 'b':
        break;
      case 'n':
        break;
      case 'r':
      case '\"':
      case '\'':
      case '\\':
        break;
      case 't':
        break;
      case 'u':
      case 'x':
        local_3c = 4;
        if (*pcVar2 == 'x') {
          local_3c = 2;
        }
        if (local_2c < iVar3) {
          for (; local_3c = local_3c + -1, -1 < local_3c && local_2c < iVar3;
              local_2c = local_2c + 1) {
            pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&in_RSI->script);
            iVar1 = getHexitValue(in_RSI,*pcVar2);
            if (iVar1 < 0) break;
          }
        }
      }
      iVar1 = local_2c;
    }
    local_2c = iVar1;
    std::__cxx11::string::append((ulong)in_RDI,'\x01');
  } while( true );
}

Assistant:

std::string SelectionCompiler::getUnescapedStringLiteral() {
    /** @todo */
    std::string sb(cchToken - 2, ' ');

    int ichMax = ichToken + cchToken - 1;
    int ich    = ichToken + 1;

    while (ich < ichMax) {
      char ch = script[ich++];
      if (ch == '\\' && ich < ichMax) {
        ch = script[ich++];
        switch (ch) {
        case 'b':
          ch = '\b';
          break;
        case 'n':
          ch = '\n';
          break;
        case 't':
          ch = '\t';
          break;
        case 'r':
          ch = '\r';
          // fall into
        case '"':
        case '\\':
        case '\'':
          break;
        case 'x':
        case 'u':
          int digitCount = ch == 'x' ? 2 : 4;
          if (ich < ichMax) {
            int unicode = 0;
            for (int k = digitCount; --k >= 0 && ich < ichMax;) {
              char chT  = script[ich];
              int hexit = getHexitValue(chT);
              if (hexit < 0) break;
              unicode <<= 4;
              unicode += hexit;
              ++ich;
            }
            ch = (char)unicode;
          }
        }
      }
      sb.append(1, ch);
    }

    return sb;
  }